

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# attrs.c
# Opt level: O1

void CheckAttrValidity(TidyDocImpl *doc,Node *node,AttVal *attval,ctmbstr *list)

{
  Bool BVar1;
  uint code;
  
  if ((attval == (AttVal *)0x0) || (attval->value == (tmbstr)0x0)) {
    code = 0x256;
  }
  else {
    CheckLowerCaseAttrValue(doc,node,attval);
    BVar1 = AttrValueIsAmong(attval,list);
    if (BVar1 != no) {
      return;
    }
    code = 0x22b;
  }
  prvTidyReportAttrError(doc,node,attval,code);
  return;
}

Assistant:

static void CheckAttrValidity( TidyDocImpl* doc, Node *node, AttVal *attval,
                               ctmbstr const list[])
{
    if (!AttrHasValue(attval))
    {
        TY_(ReportAttrError)( doc, node, attval, MISSING_ATTR_VALUE);
        return;
    }

    CheckLowerCaseAttrValue( doc, node, attval );

    if (!AttrValueIsAmong(attval, list))
        TY_(ReportAttrError)( doc, node, attval, BAD_ATTRIBUTE_VALUE);
}